

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int re_parse_alternative(REParseState *s,BOOL is_backward_dir)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  size_t __n;
  int in_ESI;
  long *in_RDI;
  size_t term_size;
  size_t end;
  size_t term_start;
  size_t start;
  int ret;
  uint8_t *p;
  BOOL in_stack_00000084;
  REParseState *in_stack_00000088;
  size_t new_size;
  DynBuf *s_00;
  
  lVar1 = in_RDI[1];
  while (((pcVar2 = (char *)in_RDI[6], pcVar2 < (char *)in_RDI[7] && (*pcVar2 != '|')) &&
         (*pcVar2 != ')'))) {
    s_00 = (DynBuf *)in_RDI[1];
    iVar3 = re_parse_term(in_stack_00000088,in_stack_00000084);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (in_ESI != 0) {
      new_size = in_RDI[1];
      __n = new_size - (long)s_00;
      iVar3 = dbuf_realloc(s_00,new_size);
      if (iVar3 != 0) {
        return -1;
      }
      memmove((void *)(*in_RDI + lVar1 + __n),(void *)(*in_RDI + lVar1),new_size - lVar1);
      memcpy((void *)(*in_RDI + lVar1),(void *)(*in_RDI + new_size),__n);
    }
  }
  return 0;
}

Assistant:

static int re_parse_alternative(REParseState *s, BOOL is_backward_dir)
{
    const uint8_t *p;
    int ret;
    size_t start, term_start, end, term_size;

    start = s->byte_code.size;
    for(;;) {
        p = s->buf_ptr;
        if (p >= s->buf_end)
            break;
        if (*p == '|' || *p == ')')
            break;
        term_start = s->byte_code.size;
        ret = re_parse_term(s, is_backward_dir);
        if (ret)
            return ret;
        if (is_backward_dir) {
            /* reverse the order of the terms (XXX: inefficient, but
               speed is not really critical here) */
            end = s->byte_code.size;
            term_size = end - term_start;
            if (dbuf_realloc(&s->byte_code, end + term_size))
                return -1;
            memmove(s->byte_code.buf + start + term_size,
                    s->byte_code.buf + start,
                    end - start);
            memcpy(s->byte_code.buf + start, s->byte_code.buf + end,
                   term_size);
        }
    }
    return 0;
}